

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

uint TA_SAREXT_FramePPLB(TA_ParamHolderPriv *params)

{
  uint uVar1;
  long in_RDI;
  
  uVar1 = TA_SAREXT_Lookback(**(double **)(in_RDI + 0x10),
                             *(double *)(*(long *)(in_RDI + 0x10) + 0x10),
                             *(double *)(*(long *)(in_RDI + 0x10) + 0x20),
                             *(double *)(*(long *)(in_RDI + 0x10) + 0x30),
                             *(double *)(*(long *)(in_RDI + 0x10) + 0x40),
                             *(double *)(*(long *)(in_RDI + 0x10) + 0x50),
                             *(double *)(*(long *)(in_RDI + 0x10) + 0x60),
                             *(double *)(*(long *)(in_RDI + 0x10) + 0x70));
  return uVar1;
}

Assistant:

unsigned int TA_SAREXT_FramePPLB( const TA_ParamHolderPriv *params )
/* Generated */ {
/* Generated */    return TA_SAREXT_Lookback(params->optIn[0].data.optInReal, /* optInStartValue*/
/* Generated */                        params->optIn[1].data.optInReal, /* optInOffsetOnReverse*/
/* Generated */                        params->optIn[2].data.optInReal, /* optInAccelerationInitLong*/
/* Generated */                        params->optIn[3].data.optInReal, /* optInAccelerationLong*/
/* Generated */                        params->optIn[4].data.optInReal, /* optInAccelerationMaxLong*/
/* Generated */                        params->optIn[5].data.optInReal, /* optInAccelerationInitShort*/
/* Generated */                        params->optIn[6].data.optInReal, /* optInAccelerationShort*/
/* Generated */                        params->optIn[7].data.optInReal /* optInAccelerationMaxShort*/ );
/* Generated */ }